

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

object * constDefinition(void)

{
  item *x_00;
  object *poVar1;
  item *x;
  object *obj;
  
  x_00 = (item *)calloc(1,0x30);
  if (((currentSymbol != 0x25f) && (currentSymbol != 0x261)) && (currentSymbol != 0x26d)) {
    mark("bad type in constant definition");
    exit(-1);
  }
  getSymbol();
  if (currentSymbol != 0x1f5) {
    mark("missing identifier in constant defintion");
    exit(-1);
  }
  poVar1 = newObj(0x2bd);
  getSymbol();
  if (currentSymbol == 0x65) {
    getSymbol();
    simpleExpression(x_00);
    if (x_00->mode == 0x2bd) {
      poVar1->val = x_00->a;
      poVar1->typeIndex = x_00->typeIndex;
    }
    return poVar1;
  }
  mark("missing assignment operator");
  exit(-1);
}

Assistant:

object * constDefinition(void)  {
	variable struct object *obj;
	variable struct item *x;
	x = NULL; obj = NULL;
	allocMem(x);
	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) {
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			obj = newObj(CLASS_CONST);
			getSymbol();
			if (currentSymbol == SYMBOL_ASSIGN) {
				getSymbol();
				simpleExpression(x);
				if (x->mode == CLASS_CONST) {
					obj->val = x->a;
					obj->typeIndex = x->typeIndex;
				}
			} else {
				mark("missing assignment operator");
				exit(-1);
			}
		} else {
			mark("missing identifier in constant defintion");
			exit(-1);
		}
	} else {
		mark("bad type in constant definition");
		exit(-1);
	}
	return obj;
}